

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O2

uint32_t F(mbedtls_blowfish_context *ctx,uint32_t x)

{
  return (*(int *)((long)ctx->S[1] + (ulong)(x >> 0xe & 0x3fc)) + ctx->S[0][x >> 0x18] ^
         ctx->S[2][x >> 8 & 0xff]) + ctx->S[3][x & 0xff];
}

Assistant:

static uint32_t F( mbedtls_blowfish_context *ctx, uint32_t x )
{
   unsigned short a, b, c, d;
   uint32_t  y;

   d = (unsigned short)(x & 0xFF);
   x >>= 8;
   c = (unsigned short)(x & 0xFF);
   x >>= 8;
   b = (unsigned short)(x & 0xFF);
   x >>= 8;
   a = (unsigned short)(x & 0xFF);
   y = ctx->S[0][a] + ctx->S[1][b];
   y = y ^ ctx->S[2][c];
   y = y + ctx->S[3][d];

   return( y );
}